

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * string_proper(char *argument)

{
  byte bVar1;
  char *pcVar2;
  byte bVar3;
  char *s;
  
  pcVar2 = argument;
  while( true ) {
    while( true ) {
      bVar1 = *argument;
      if (bVar1 != 0x20) break;
      argument = (char *)((byte *)argument + 1);
    }
    if (bVar1 == 0) break;
    bVar3 = bVar1 - 0x20;
    if (0x19 < (byte)(bVar1 + 0x9f)) {
      bVar3 = bVar1;
    }
    *argument = bVar3;
    for (; (*argument & 0xdfU) != 0; argument = (char *)((byte *)argument + 1)) {
    }
  }
  return pcVar2;
}

Assistant:

char *string_proper(char *argument)
{
	char *s;

	s = argument;

	while (*s != '\0')
	{
		if (*s != ' ')
		{
			*s = UPPER(*s);

			while (*s != ' ' && *s != '\0')
			{
				s++;
			}
		}
		else
		{
			s++;
		}
	}

	return argument;
}